

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::GeneratorHelpers::unit
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  int iVar1;
  char *pcVar2;
  UErrorCode *extraout_RDX;
  bool bVar3;
  MeasureUnit *this;
  CurrencyUnit currency;
  CurrencyUnit local_48;
  
  this = &macros->unit;
  pcVar2 = MeasureUnit::getType(this);
  iVar1 = strcmp("currency",pcVar2);
  if (iVar1 == 0) {
    UnicodeString::doAppend(sb,L"currency/",0,-1);
    CurrencyUnit::CurrencyUnit(&local_48,this,status);
    bVar3 = *status < U_ILLEGAL_ARGUMENT_ERROR;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      UnicodeString::doAppend(sb,(UChar *)&local_48.super_MeasureUnit.field_0x14,0,-1);
    }
    CurrencyUnit::~CurrencyUnit(&local_48);
  }
  else {
    pcVar2 = MeasureUnit::getType(this);
    iVar1 = strcmp("none",pcVar2);
    if (iVar1 == 0) {
      pcVar2 = MeasureUnit::getSubtype(this);
      iVar1 = strcmp("percent",pcVar2);
      if (iVar1 == 0) {
        UnicodeString::doAppend(sb,L"percent",0,-1);
      }
      else {
        pcVar2 = MeasureUnit::getSubtype(this);
        iVar1 = strcmp("permille",pcVar2);
        if (iVar1 != 0) {
          return false;
        }
        UnicodeString::doAppend(sb,L"permille",0,-1);
      }
    }
    else {
      UnicodeString::doAppend(sb,L"measure-unit/",0,-1);
      blueprint_helpers::generateMeasureUnitOption(this,sb,extraout_RDX);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool GeneratorHelpers::unit(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (utils::unitIsCurrency(macros.unit)) {
        sb.append(u"currency/", -1);
        CurrencyUnit currency(macros.unit, status);
        if (U_FAILURE(status)) {
            return false;
        }
        blueprint_helpers::generateCurrencyOption(currency, sb, status);
        return true;
    } else if (utils::unitIsNoUnit(macros.unit)) {
        if (utils::unitIsPercent(macros.unit)) {
            sb.append(u"percent", -1);
            return true;
        } else if (utils::unitIsPermille(macros.unit)) {
            sb.append(u"permille", -1);
            return true;
        } else {
            // Default value is not shown in normalized form
            return false;
        }
    } else {
        sb.append(u"measure-unit/", -1);
        blueprint_helpers::generateMeasureUnitOption(macros.unit, sb, status);
        return true;
    }
}